

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_4,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
          (PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
          *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
            (this,(EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)other);
  auVar1 = *(undefined1 (*) [16])other;
  auVar2._8_4_ = auVar1._8_4_;
  auVar2._0_8_ = auVar1._8_8_;
  auVar2._12_4_ = auVar1._12_4_;
  *(undefined1 (*) [16])this = auVar2;
  auVar1 = *(undefined1 (*) [16])other;
  auVar3._8_4_ = auVar1._8_4_;
  auVar3._0_8_ = auVar1._8_8_;
  auVar3._12_4_ = auVar1._12_4_;
  *(undefined1 (*) [16])(this + 0x10) = auVar3;
  return (Matrix<double,_4,_1,_0,_4,_1> *)this;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }